

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O2

void elf32_writestabstr(FILE *f)

{
  list *plVar1;
  
  if (stabdebugidx != 0) {
    plVar1 = &stabcompunits;
    while (plVar1 = (list *)plVar1->first, plVar1->first != (node *)0x0) {
      elf_writestrtab(f,(StrTabList *)&plVar1[2].dummy);
    }
  }
  return;
}

Assistant:

static void elf32_writestabstr(FILE *f)
{
  if (stabdebugidx) {
    struct StabCompUnit *cu;

    for (cu=(struct StabCompUnit *)stabcompunits.first;
         cu->n.next!=NULL; cu=(struct StabCompUnit *)cu->n.next)
      elf_writestrtab(f,&cu->strtab);
  }
}